

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::
TransformPromiseNode<kj::_::Void,_kj::Own<kj::AsyncIoStream>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-test.c++:652:13),_kj::_::PropagateException>
::getImpl(TransformPromiseNode<kj::_::Void,_kj::Own<kj::AsyncIoStream>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_io_test_c__:652:13),_kj::_::PropagateException>
          *this,ExceptionOrValue *output)

{
  Exception *in;
  ExceptionOr<kj::_::Void> *pEVar1;
  Own<kj::AsyncIoStream> *in_00;
  Void local_5d1;
  ExceptionOr<kj::_::Void> local_5d0;
  Own<kj::AsyncIoStream> *local_468;
  Own<kj::AsyncIoStream> *depValue;
  ExceptionOr<kj::_::Void> local_308;
  Exception *local_1a0;
  Exception *depException;
  undefined1 local_188 [8];
  ExceptionOr<kj::Own<kj::AsyncIoStream>_> depResult;
  ExceptionOrValue *output_local;
  TransformPromiseNode<kj::_::Void,_kj::Own<kj::AsyncIoStream>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_io_test_c__:652:13),_kj::_::PropagateException>
  *this_local;
  
  depResult.value.ptr.ptr = (AsyncIoStream *)output;
  ExceptionOr<kj::Own<kj::AsyncIoStream>_>::ExceptionOr
            ((ExceptionOr<kj::Own<kj::AsyncIoStream>_> *)local_188);
  TransformPromiseNodeBase::getDepResult
            (&this->super_TransformPromiseNodeBase,(ExceptionOrValue *)local_188);
  local_1a0 = readMaybe<kj::Exception>((Maybe<kj::Exception> *)local_188);
  if (local_1a0 == (Exception *)0x0) {
    local_468 = readMaybe<kj::AsyncIoStream>
                          ((Maybe<kj::Own<kj::AsyncIoStream>_> *)
                           ((long)&depResult.super_ExceptionOrValue.exception.ptr.field_1 + 0x150));
    if (local_468 != (Own<kj::AsyncIoStream> *)0x0) {
      in_00 = mv<kj::Own<kj::AsyncIoStream>>(local_468);
      MaybeVoidCaller<kj::Own<kj::AsyncIoStream>,kj::_::Void>::
      apply<kj::(anonymous_namespace)::TestCase637::run()::__1>((Type *)&this->field_0x20,in_00);
      handle(&local_5d0,this,&local_5d1);
      pEVar1 = ExceptionOrValue::as<kj::_::Void>((ExceptionOrValue *)depResult.value.ptr.ptr);
      ExceptionOr<kj::_::Void>::operator=(pEVar1,&local_5d0);
      ExceptionOr<kj::_::Void>::~ExceptionOr(&local_5d0);
    }
  }
  else {
    in = mv<kj::Exception>(local_1a0);
    MaybeVoidCaller<kj::Exception,_kj::_::PropagateException::Bottom>::
    apply<kj::_::PropagateException>((Bottom *)&depValue,(PropagateException *)&this->field_0x21,in)
    ;
    handle(&local_308,this,(Bottom *)&depValue);
    pEVar1 = ExceptionOrValue::as<kj::_::Void>((ExceptionOrValue *)depResult.value.ptr.ptr);
    ExceptionOr<kj::_::Void>::operator=(pEVar1,&local_308);
    ExceptionOr<kj::_::Void>::~ExceptionOr(&local_308);
    PropagateException::Bottom::~Bottom((Bottom *)&depValue);
  }
  ExceptionOr<kj::Own<kj::AsyncIoStream>_>::~ExceptionOr
            ((ExceptionOr<kj::Own<kj::AsyncIoStream>_> *)local_188);
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_MAYBE(depException, depResult.exception) {
      output.as<T>() = handle(
          MaybeVoidCaller<Exception, FixVoid<ReturnType<ErrorFunc, Exception>>>::apply(
              errorHandler, kj::mv(*depException)));
    } else KJ_IF_MAYBE(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(*depValue)));
    }
  }